

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

void arkInterpPrintMem_Lagrange(ARKInterp I,FILE *outfile)

{
  void *pvVar1;
  int *piVar2;
  long lVar3;
  
  if (I != (ARKInterp)0x0) {
    fprintf((FILE *)outfile,"arkode_interp (Lagrange): nmax = %i\n",(ulong)*I->content);
    fprintf((FILE *)outfile,"arkode_interp (Lagrange): nhist = %i\n",
            (ulong)*(uint *)((long)I->content + 0x18));
    pvVar1 = I->content;
    if (*(long *)((long)pvVar1 + 0x10) != 0) {
      fwrite("arkode_interp (Lagrange): thist =",0x21,1,(FILE *)outfile);
      piVar2 = (int *)I->content;
      if (0 < *piVar2) {
        lVar3 = 0;
        do {
          fprintf((FILE *)outfile,"  %.16g",*(undefined8 *)(*(long *)(piVar2 + 4) + lVar3 * 8));
          lVar3 = lVar3 + 1;
          piVar2 = (int *)I->content;
        } while (lVar3 < *piVar2);
      }
      fputc(10,(FILE *)outfile);
      pvVar1 = I->content;
    }
    if (*(long *)((long)pvVar1 + 8) != 0) {
      fwrite("arkode_interp (Lagrange): yhist ptrs =",0x26,1,(FILE *)outfile);
      piVar2 = (int *)I->content;
      if (0 < *piVar2) {
        lVar3 = 0;
        do {
          fprintf((FILE *)outfile,"  %p",*(undefined8 *)(*(long *)(piVar2 + 2) + lVar3 * 8));
          lVar3 = lVar3 + 1;
          piVar2 = (int *)I->content;
        } while (lVar3 < *piVar2);
      }
      fputc(10,(FILE *)outfile);
      return;
    }
  }
  return;
}

Assistant:

void arkInterpPrintMem_Lagrange(ARKInterp I, FILE *outfile)
{
  int i;
  if (I != NULL) {
    fprintf(outfile, "arkode_interp (Lagrange): nmax = %i\n", LINT_NMAX(I));
    fprintf(outfile, "arkode_interp (Lagrange): nhist = %i\n", LINT_NHIST(I));
    if (LINT_THIST(I) != NULL) {
      fprintf(outfile, "arkode_interp (Lagrange): thist =");
      for (i=0; i<LINT_NMAX(I); i++)
        fprintf(outfile, "  %"RSYM,LINT_TJ(I,i));
      fprintf(outfile, "\n");
    }
    if (LINT_YHIST(I) != NULL) {
      fprintf(outfile, "arkode_interp (Lagrange): yhist ptrs =");
      for (i=0; i<LINT_NMAX(I); i++)
        fprintf(outfile, "  %p",(void*) LINT_YJ(I,i));
      fprintf(outfile, "\n");
    }
#ifdef SUNDIALS_DEBUG_PRINTVEC
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        fprintf(outfile, "arkode_interp (Lagrange): yhist[%i]:\n",i);
        N_VPrintFile(LINT_YJ(I,i), outfile);
      }
    }
#endif
  }
}